

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Clear(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this)

{
  Rep *pRVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = (long)(this->super_RepeatedPtrFieldBase).current_size_;
  if (0 < lVar3) {
    pRVar1 = (this->super_RepeatedPtrFieldBase).rep_;
    lVar4 = 0;
    do {
      puVar2 = (undefined8 *)pRVar1->elements[lVar4];
      lVar4 = lVar4 + 1;
      puVar2[1] = 0;
      *(undefined1 *)*puVar2 = 0;
    } while (lVar3 != lVar4);
    (this->super_RepeatedPtrFieldBase).current_size_ = 0;
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::Clear() {
  const int n = current_size_;
  GOOGLE_DCHECK_GE(n, 0);
  if (n > 0) {
    void* const* elements = rep_->elements;
    int i = 0;
    do {
      TypeHandler::Clear(cast<TypeHandler>(elements[i++]));
    } while (i < n);
    current_size_ = 0;
  }
}